

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O3

Graph * Omega_h::unmap_graph(Graph *__return_storage_ptr__,LOs *a2b,Graph *b2c)

{
  int *piVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  Alloc *pAVar5;
  Graph *this;
  Alloc *this_00;
  Alloc *this_01;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  undefined4 *puVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  Write<int> ac2c;
  LOs a2ac;
  Read<int> a_degrees;
  LOs b_degrees;
  LOs bc2c;
  LOs b2bc;
  type f;
  string local_218;
  Alloc *local_1f8;
  void *local_1f0;
  Alloc *local_1e8;
  void *local_1e0;
  Alloc *local_1d8;
  void *local_1d0;
  Write<int> local_1c8;
  Read<int> local_1b8;
  Read<int> *local_1a8;
  Omega_h *local_1a0;
  LOs local_198;
  Read<int> local_188;
  LOs local_178;
  Write<int> local_168;
  Read<int> local_158;
  LOs local_148;
  Alloc *local_138;
  void *local_130;
  Alloc *local_128;
  void *pvStack_120;
  Alloc *local_118;
  void *pvStack_110;
  Alloc *local_108;
  void *pvStack_100;
  Alloc *local_f8;
  void *pvStack_f0;
  Alloc *local_e8;
  void *pvStack_e0;
  Graph *local_d8;
  Read<signed_char> local_d0;
  Write<int> local_c0;
  Alloc *local_b0;
  void *local_a8;
  Alloc *local_a0;
  void *local_98;
  Alloc *local_90;
  void *local_88;
  Alloc *local_80;
  void *local_78;
  Alloc *local_70;
  void *local_68;
  Alloc *local_60;
  void *local_58;
  Alloc *local_50;
  void *local_48;
  Alloc *local_40;
  void *local_38;
  
  local_90 = (b2c->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90 = (Alloc *)(local_90->size * 8 + 1);
    }
    else {
      local_90->use_count = local_90->use_count + 1;
    }
  }
  this_01 = local_90;
  pvVar3 = (b2c->a2ab).write_.shared_alloc_.direct_ptr;
  local_a0 = (b2c->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0 = (Alloc *)(local_a0->size * 8 + 1);
    }
    else {
      local_a0->use_count = local_a0->use_count + 1;
    }
  }
  this_00 = local_a0;
  pvVar4 = (b2c->ab2b).write_.shared_alloc_.direct_ptr;
  bVar11 = local_90 != (Alloc *)0x0;
  bVar12 = ((ulong)local_90 & 7) == 0;
  local_178.write_.shared_alloc_.alloc = local_90;
  if (bVar12 && bVar11) {
    if (entering_parallel == '\x01') {
      local_178.write_.shared_alloc_.alloc = (Alloc *)(local_90->size * 8 + 1);
    }
    else {
      local_90->use_count = local_90->use_count + 1;
    }
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_178.write_.shared_alloc_.direct_ptr = pvVar3;
  local_98 = pvVar4;
  local_88 = pvVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
  get_degrees((Omega_h *)&local_b0,&local_178,&local_218);
  local_1a0 = (Omega_h *)&local_b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,(ulong)(local_218.field_2._M_allocated_capacity + 1))
    ;
  }
  pAVar5 = local_178.write_.shared_alloc_.alloc;
  if (((ulong)local_178.write_.shared_alloc_.alloc & 7) == 0 &&
      local_178.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_178.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_178.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_148.write_.shared_alloc_.alloc = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)local_148.write_.shared_alloc_.alloc & 7) == 0 &&
      local_148.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148.write_.shared_alloc_.alloc =
           (Alloc *)((local_148.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_148.write_.shared_alloc_.alloc)->use_count =
           (local_148.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_148.write_.shared_alloc_.direct_ptr = (a2b->write_).shared_alloc_.direct_ptr;
  local_158.write_.shared_alloc_.alloc = local_b0;
  if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158.write_.shared_alloc_.alloc = (Alloc *)(local_b0->size * 8 + 1);
    }
    else {
      local_b0->use_count = local_b0->use_count + 1;
    }
  }
  local_158.write_.shared_alloc_.direct_ptr = local_a8;
  local_d8 = __return_storage_ptr__;
  unmap<int>((Omega_h *)&local_c0,&local_148,&local_158,1);
  read<int>((Omega_h *)&local_138,&local_c0);
  if (((ulong)local_c0.shared_alloc_.alloc & 7) == 0 && local_c0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_c0.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c0.shared_alloc_.alloc);
      operator_delete(local_c0.shared_alloc_.alloc,0x48);
    }
  }
  pAVar5 = local_158.write_.shared_alloc_.alloc;
  if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
      local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_158.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_158.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_148.write_.shared_alloc_.alloc;
  if (((ulong)local_148.write_.shared_alloc_.alloc & 7) == 0 &&
      local_148.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_148.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_148.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_188.write_.shared_alloc_.alloc = local_138;
  if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_188.write_.shared_alloc_.alloc = (Alloc *)(local_138->size * 8 + 1);
    }
    else {
      local_138->use_count = local_138->use_count + 1;
    }
  }
  local_188.write_.shared_alloc_.direct_ptr = local_130;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
  offset_scan<int>((Omega_h *)&local_1b8,&local_188,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,(ulong)(local_218.field_2._M_allocated_capacity + 1))
    ;
  }
  pAVar5 = local_188.write_.shared_alloc_.alloc;
  if (((ulong)local_188.write_.shared_alloc_.alloc & 7) == 0 &&
      local_188.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_188.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_188.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar5 & 1) == 0) {
    uVar7 = pAVar5->size;
  }
  else {
    uVar7 = (ulong)pAVar5 >> 3;
  }
  local_1a8 = &local_1b8;
  iVar6 = Read<int>::last(local_1a8);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
  Write<int>::Write(&local_1c8,iVar6,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,(ulong)(local_218.field_2._M_allocated_capacity + 1))
    ;
  }
  local_80 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80 = (Alloc *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&local_80->size)->_M_allocated_capacity * 8 + 1);
    }
    else {
      local_80->use_count = local_80->use_count + 1;
    }
  }
  local_78 = (a2b->write_).shared_alloc_.direct_ptr;
  local_70 = this_01;
  if (bVar12 && bVar11) {
    if (entering_parallel == '\x01') {
      local_70 = (Alloc *)(this_01->size * 8 + 1);
    }
    else {
      this_01->use_count = this_01->use_count + 1;
    }
  }
  local_60 = local_1b8.write_.shared_alloc_.alloc;
  if (((ulong)local_1b8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60 = (Alloc *)((local_1b8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1b8.write_.shared_alloc_.alloc)->use_count =
           (local_1b8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_58 = local_1b8.write_.shared_alloc_.direct_ptr;
  local_50 = local_1c8.shared_alloc_.alloc;
  if (((ulong)local_1c8.shared_alloc_.alloc & 7) == 0 &&
      local_1c8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50 = (Alloc *)((local_1c8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1c8.shared_alloc_.alloc)->use_count = (local_1c8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_48 = local_1c8.shared_alloc_.direct_ptr;
  local_40 = this_00;
  bVar13 = ((ulong)this_00 & 7) == 0;
  if (bVar13 && this_00 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40 = (Alloc *)(this_00->size * 8 + 1);
    }
    else {
      this_00->use_count = this_00->use_count + 1;
    }
  }
  local_128 = local_80;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_128 = (Alloc *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)&local_80->size)->_M_allocated_capacity * 8 + 1);
    }
    else {
      local_80->use_count = local_80->use_count + 1;
    }
  }
  local_118 = local_70;
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118 = (Alloc *)(local_70->size * 8 + 1);
    }
    else {
      local_70->use_count = local_70->use_count + 1;
    }
  }
  local_108 = local_60;
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108 = (Alloc *)(local_60->size * 8 + 1);
    }
    else {
      local_60->use_count = local_60->use_count + 1;
    }
  }
  pvStack_100 = local_1b8.write_.shared_alloc_.direct_ptr;
  local_f8 = local_50;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8 = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  pvStack_f0 = local_1c8.shared_alloc_.direct_ptr;
  local_e8 = local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8 = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  iVar6 = (int)(uVar7 >> 2);
  pvStack_120 = local_78;
  pvStack_110 = pvVar3;
  pvStack_e0 = pvVar4;
  local_68 = pvVar3;
  local_38 = pvVar4;
  if (0 < iVar6) {
    local_218._M_dataplus._M_p = (pointer)local_128;
    if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
      local_128->use_count = local_128->use_count + -1;
      local_218._M_dataplus._M_p =
           (pointer)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&local_128->size)->_M_allocated_capacity * 8 + 1);
    }
    local_128 = (Alloc *)0x0;
    pvStack_120 = (void *)0x0;
    local_218.field_2._M_allocated_capacity = (size_type)local_118;
    if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
      local_118->use_count = local_118->use_count + -1;
      local_218.field_2._M_allocated_capacity = local_118->size * 8 + 1;
    }
    local_118 = (Alloc *)0x0;
    pvStack_110 = (void *)0x0;
    local_1f0 = local_1b8.write_.shared_alloc_.direct_ptr;
    local_1f8 = local_108;
    if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
      local_108->use_count = local_108->use_count + -1;
      local_1f8 = (Alloc *)(local_108->size * 8 + 1);
    }
    local_108 = (Alloc *)0x0;
    pvStack_100 = (void *)0x0;
    local_1e0 = local_1c8.shared_alloc_.direct_ptr;
    local_1e8 = local_f8;
    if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
      local_f8->use_count = local_f8->use_count + -1;
      local_1e8 = (Alloc *)(local_f8->size * 8 + 1);
    }
    local_f8 = (Alloc *)0x0;
    pvStack_f0 = (void *)0x0;
    local_1d8 = local_e8;
    if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
      local_e8->use_count = local_e8->use_count + -1;
      local_1d8 = (Alloc *)(local_e8->size * 8 + 1);
    }
    local_e8 = (Alloc *)0x0;
    pvStack_e0 = (void *)0x0;
    entering_parallel = '\0';
    lVar8 = 0;
    do {
      iVar2 = *(int *)((long)local_1b8.write_.shared_alloc_.direct_ptr + lVar8 * 4);
      lVar9 = (long)iVar2;
      if (iVar2 < *(int *)((long)local_1b8.write_.shared_alloc_.direct_ptr + lVar8 * 4 + 4)) {
        puVar10 = (undefined4 *)
                  ((long)pvVar4 +
                  (long)*(int *)((long)pvVar3 + (long)*(int *)((long)local_78 + lVar8 * 4) * 4) * 4)
        ;
        do {
          *(undefined4 *)((long)local_1c8.shared_alloc_.direct_ptr + lVar9 * 4) = *puVar10;
          lVar9 = lVar9 + 1;
          puVar10 = puVar10 + 1;
        } while (lVar9 < *(int *)((long)local_1b8.write_.shared_alloc_.direct_ptr + lVar8 * 4 + 4));
      }
      lVar8 = lVar8 + 1;
    } while ((int)lVar8 != iVar6);
    local_218._M_string_length = (size_type)local_78;
    local_218.field_2._8_8_ = pvVar3;
    local_1d0 = pvVar4;
    unmap_graph(Omega_h::Read<int>,Omega_h::Graph)::$_0::~__0((__0 *)&local_218);
  }
  unmap_graph(Omega_h::Read<int>,Omega_h::Graph)::$_0::~__0((__0 *)&local_128);
  this = local_d8;
  local_198.write_.shared_alloc_.alloc = local_1b8.write_.shared_alloc_.alloc;
  if (((ulong)local_1b8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_198.write_.shared_alloc_.alloc =
           (Alloc *)((local_1b8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1b8.write_.shared_alloc_.alloc)->use_count =
           (local_1b8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_198.write_.shared_alloc_.direct_ptr = local_1b8.write_.shared_alloc_.direct_ptr;
  local_168.shared_alloc_.alloc = local_1c8.shared_alloc_.alloc;
  if (((ulong)local_1c8.shared_alloc_.alloc & 7) == 0 &&
      local_1c8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168.shared_alloc_.alloc = (Alloc *)((local_1c8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1c8.shared_alloc_.alloc)->use_count = (local_1c8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_168.shared_alloc_.direct_ptr = local_1c8.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_d0,&local_168);
  Graph::Graph(this,&local_198,(LOs *)&local_d0);
  if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_d0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d0.write_.shared_alloc_.alloc);
      operator_delete(local_d0.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar5 = local_168.shared_alloc_.alloc;
  if (((ulong)local_168.shared_alloc_.alloc & 7) == 0 &&
      local_168.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_168.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_168.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_198.write_.shared_alloc_.alloc;
  if (((ulong)local_198.write_.shared_alloc_.alloc & 7) == 0 &&
      local_198.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_198.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_198.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  unmap_graph(Omega_h::Read<int>,Omega_h::Graph)::$_0::~__0((__0 *)&local_80);
  if (((ulong)local_1c8.shared_alloc_.alloc & 7) == 0 &&
      local_1c8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1c8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1c8.shared_alloc_.alloc);
      operator_delete(local_1c8.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_1b8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1b8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1b8.write_.shared_alloc_.alloc);
      operator_delete(local_1b8.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
    piVar1 = &local_138->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_138);
      operator_delete(local_138,0x48);
    }
  }
  if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
    piVar1 = &local_b0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b0);
      operator_delete(local_b0,0x48);
    }
  }
  if (bVar13 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
    }
  }
  if (bVar12 && bVar11) {
    piVar1 = &this_01->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_01);
      operator_delete(this_01,0x48);
    }
  }
  return this;
}

Assistant:

Graph unmap_graph(LOs a2b, Graph b2c) {
  auto b2bc = b2c.a2ab;
  auto bc2c = b2c.ab2b;
  auto b_degrees = get_degrees(b2bc);
  auto a_degrees = read(unmap(a2b, b_degrees, 1));
  auto a2ac = offset_scan(a_degrees);
  auto na = a2b.size();
  Write<LO> ac2c(a2ac.last());
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    auto bc = b2bc[b];
    for (auto ac = a2ac[a]; ac < a2ac[a + 1]; ++ac) {
      ac2c[ac] = bc2c[bc++];
    }
  };
  parallel_for(na, f, "unmap_graph");
  return Graph(a2ac, ac2c);
}